

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lexer.cpp
# Opt level: O1

optional<unsigned_long> __thiscall wasm::WATParser::Lexer::takeOffset(Lexer *this)

{
  pointer pAVar1;
  ulong uVar2;
  string_view sVar3;
  optional<unsigned_long> oVar4;
  ulong local_c0;
  optional<wasm::WATParser::(anonymous_namespace)::LexResult> result;
  Lexer subLexer;
  long local_40 [2];
  char local_30;
  _Storage<unsigned_long,_true> __return_storage_ptr__;
  
  sVar3 = next(this);
  __return_storage_ptr__._M_value = (unsigned_long)&local_c0;
  anon_unknown_0::keyword
            ((optional<wasm::WATParser::(anonymous_namespace)::LexResult> *)__return_storage_ptr__,
             sVar3);
  if (((result.super__Optional_base<wasm::WATParser::(anonymous_namespace)::LexResult,_true,_true>.
        _M_payload.super__Optional_payload_base<wasm::WATParser::(anonymous_namespace)::LexResult>.
        _M_payload._8_1_ == '\x01') && (6 < local_c0)) &&
     (*(int *)(result.
               super__Optional_base<wasm::WATParser::(anonymous_namespace)::LexResult,_true,_true>.
               _M_payload.
               super__Optional_payload_base<wasm::WATParser::(anonymous_namespace)::LexResult>.
               _M_payload._M_value.span._M_len + 3) == 0x3d746573 &&
      *(int *)result.
              super__Optional_base<wasm::WATParser::(anonymous_namespace)::LexResult,_true,_true>.
              _M_payload.
              super__Optional_payload_base<wasm::WATParser::(anonymous_namespace)::LexResult>.
              _M_payload._M_value.span._M_len == 0x7366666f)) {
    sVar3._M_str = (char *)(result.
                            super__Optional_base<wasm::WATParser::(anonymous_namespace)::LexResult,_true,_true>
                            ._M_payload.
                            super__Optional_payload_base<wasm::WATParser::(anonymous_namespace)::LexResult>
                            ._M_payload._M_value.span._M_len + 7);
    local_30 = '\0';
    sVar3._M_len = local_c0 - 7;
    Lexer((Lexer *)&result.
                    super__Optional_base<wasm::WATParser::(anonymous_namespace)::LexResult,_true,_true>
                    ._M_payload.
                    super__Optional_payload_base<wasm::WATParser::(anonymous_namespace)::LexResult>.
                    _M_engaged,sVar3,
          (optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           *)&subLexer.buffer._M_str);
    if (local_30 == '\x01') {
      local_30 = '\0';
      if ((long *)subLexer.buffer._M_str != local_40) {
        operator_delete(subLexer.buffer._M_str,local_40[0] + 1);
      }
    }
    oVar4 = takeU<unsigned_long>
                      ((Lexer *)&result.
                                 super__Optional_base<wasm::WATParser::(anonymous_namespace)::LexResult,_true,_true>
                                 ._M_payload.
                                 super__Optional_payload_base<wasm::WATParser::(anonymous_namespace)::LexResult>
                                 ._M_engaged);
    __return_storage_ptr__._M_value =
         oVar4.super__Optional_base<unsigned_long,_true,_true>._M_payload.
         super__Optional_payload_base<unsigned_long>._M_payload;
    uVar2 = (ulong)oVar4.super__Optional_base<unsigned_long,_true,_true>._M_payload.
                   super__Optional_payload_base<unsigned_long>._8_4_;
    if (((undefined1  [16])
         oVar4.super__Optional_base<unsigned_long,_true,_true>._M_payload.
         super__Optional_payload_base<unsigned_long> & (undefined1  [16])0x1) ==
        (undefined1  [16])0x0) {
      if (subLexer.file.
          super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
          ._M_payload.
          super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
          .
          super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ._M_payload._24_1_ == '\x01') {
        subLexer.file.
        super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
        ._M_payload.
        super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
        .
        super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ._M_payload._24_1_ = 0;
        if (subLexer.annotations.
            super__Vector_base<wasm::WATParser::Annotation,_std::allocator<wasm::WATParser::Annotation>_>
            ._M_impl.super__Vector_impl_data._M_end_of_storage !=
            (pointer)((long)&subLexer.file.
                             super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
                             ._M_payload.
                             super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
                             .
                             super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                             ._M_payload + 8U)) {
          operator_delete(subLexer.annotations.
                          super__Vector_base<wasm::WATParser::Annotation,_std::allocator<wasm::WATParser::Annotation>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage,
                          subLexer.file.
                          super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
                          ._M_payload.
                          super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
                          .
                          super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                          ._M_payload._M_value._M_string_length + 1);
        }
      }
      if (subLexer.pos != 0) {
        operator_delete((void *)subLexer.pos,
                        (long)subLexer.annotations.
                              super__Vector_base<wasm::WATParser::Annotation,_std::allocator<wasm::WATParser::Annotation>_>
                              ._M_impl.super__Vector_impl_data._M_finish - subLexer.pos);
      }
      uVar2 = 0;
    }
    else {
      this->pos = this->pos + local_c0;
      pAVar1 = (this->annotations).
               super__Vector_base<wasm::WATParser::Annotation,_std::allocator<wasm::WATParser::Annotation>_>
               ._M_impl.super__Vector_impl_data._M_start;
      if ((this->annotations).
          super__Vector_base<wasm::WATParser::Annotation,_std::allocator<wasm::WATParser::Annotation>_>
          ._M_impl.super__Vector_impl_data._M_finish != pAVar1) {
        (this->annotations).
        super__Vector_base<wasm::WATParser::Annotation,_std::allocator<wasm::WATParser::Annotation>_>
        ._M_impl.super__Vector_impl_data._M_finish = pAVar1;
      }
      skipSpace(this);
      if (subLexer.file.
          super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
          ._M_payload.
          super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
          .
          super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ._M_payload._24_1_ == '\x01') {
        subLexer.file.
        super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
        ._M_payload.
        super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
        .
        super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ._M_payload._24_1_ = 0;
        if (subLexer.annotations.
            super__Vector_base<wasm::WATParser::Annotation,_std::allocator<wasm::WATParser::Annotation>_>
            ._M_impl.super__Vector_impl_data._M_end_of_storage !=
            (pointer)((long)&subLexer.file.
                             super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
                             ._M_payload.
                             super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
                             .
                             super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                             ._M_payload + 8U)) {
          operator_delete(subLexer.annotations.
                          super__Vector_base<wasm::WATParser::Annotation,_std::allocator<wasm::WATParser::Annotation>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage,
                          subLexer.file.
                          super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
                          ._M_payload.
                          super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
                          .
                          super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                          ._M_payload._M_value._M_string_length + 1);
        }
      }
      if (subLexer.pos != 0) {
        operator_delete((void *)subLexer.pos,
                        (long)subLexer.annotations.
                              super__Vector_base<wasm::WATParser::Annotation,_std::allocator<wasm::WATParser::Annotation>_>
                              ._M_impl.super__Vector_impl_data._M_finish - subLexer.pos);
      }
    }
  }
  else {
    uVar2 = 0;
  }
  oVar4.super__Optional_base<unsigned_long,_true,_true>._M_payload.
  super__Optional_payload_base<unsigned_long>._8_8_ = uVar2;
  oVar4.super__Optional_base<unsigned_long,_true,_true>._M_payload.
  super__Optional_payload_base<unsigned_long>._M_payload._M_value = __return_storage_ptr__._M_value;
  return (optional<unsigned_long>)
         oVar4.super__Optional_base<unsigned_long,_true,_true>._M_payload.
         super__Optional_payload_base<unsigned_long>;
}

Assistant:

std::optional<uint64_t> Lexer::takeOffset() {
  if (auto result = keyword(next())) {
    if (result->span.substr(0, 7) != "offset="sv) {
      return std::nullopt;
    }
    Lexer subLexer(result->span.substr(7));
    if (auto o = subLexer.takeU64()) {
      pos += result->span.size();
      advance();
      return o;
    }
  }
  return std::nullopt;
}